

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_Constructors_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_Constructors_Test<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int i;
  AssertionResult gtest_ar_1;
  TypeParam ht_iter_fourarg;
  TypeParam ht_iter_threearg;
  TypeParam ht_iter_twoarg;
  TypeParam ht_iter_onearg;
  TypeParam ht_iter_noarg;
  value_type *end;
  value_type *begin;
  int num_inputs;
  value_type input [4];
  int old_alloc_count;
  AssertionResult gtest_ar;
  TypeParam ht_fourarg;
  TypeParam ht_threearg;
  TypeParam ht_twoarg;
  TypeParam ht_onearg;
  TypeParam ht_noarg;
  Alloc<int,_unsigned_long,_18446744073709551615UL> alloc;
  int alloc_count;
  hasher hasher;
  undefined8 in_stack_ffffffffffffee48;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_00;
  HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffee50;
  unsigned_long *in_stack_ffffffffffffee58;
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_ffffffffffffee60;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_01;
  key_equal *in_stack_ffffffffffffee68;
  int line;
  hasher *in_stack_ffffffffffffee70;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_02;
  size_type in_stack_ffffffffffffee78;
  Type type;
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffee80;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *pAVar4;
  int *in_stack_ffffffffffffee88;
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_ffffffffffffee90;
  undefined4 in_stack_ffffffffffffeea0;
  undefined4 in_stack_ffffffffffffeea4;
  Message *in_stack_ffffffffffffeec8;
  undefined4 in_stack_ffffffffffffeed0;
  undefined4 in_stack_ffffffffffffeed4;
  value_type *in_stack_ffffffffffffef88;
  undefined4 in_stack_ffffffffffffef90;
  undefined4 in_stack_ffffffffffffef94;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_ee0;
  int local_ed0;
  undefined4 local_ecc;
  AssertionResult local_ec8 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_ea8;
  int local_e98;
  undefined4 local_e94;
  AssertionResult local_e90 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_e70;
  int local_e60;
  undefined4 local_e5c;
  AssertionResult local_e58 [2];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_e38;
  int local_e28;
  undefined4 local_e24;
  AssertionResult local_e20 [2];
  Hasher local_e00;
  Hasher local_df0;
  int local_de0;
  undefined4 local_ddc;
  AssertionResult local_dd8 [2];
  Hasher local_db8;
  Hasher local_da8;
  int local_d98;
  undefined4 local_d94;
  AssertionResult local_d90 [2];
  Hasher local_d70;
  Hasher local_d60;
  int local_d50;
  undefined4 local_d4c;
  AssertionResult local_d48 [2];
  Hasher local_d28;
  Hasher local_d18;
  int local_d08;
  undefined4 local_d04;
  AssertionResult local_d00 [2];
  Hasher local_ce0;
  Hasher local_cd0;
  int local_cc0;
  undefined4 local_cbc;
  AssertionResult local_cb8 [2];
  Hasher local_c98;
  Hasher local_c88;
  int local_c78;
  undefined4 local_c74;
  AssertionResult local_c70 [2];
  Hasher local_c50;
  Hasher local_c40;
  int local_c30;
  undefined4 local_c2c;
  AssertionResult local_c28 [2];
  Hasher local_c08;
  Hasher local_bf8;
  int local_be8;
  undefined4 local_be4;
  AssertionResult local_be0 [2];
  Hasher local_bc0;
  Hasher local_bb0;
  int local_ba0;
  undefined4 local_b9c;
  AssertionResult local_b98 [2];
  Hasher local_b78;
  Hasher local_b68;
  int local_b58;
  undefined4 local_b54;
  AssertionResult local_b50 [2];
  Hasher local_b30;
  Hasher local_b20;
  int local_b10;
  undefined4 local_b0c;
  AssertionResult local_b08 [2];
  Hasher local_ae8;
  Hasher local_ad8;
  int local_ac8;
  undefined4 local_ac4;
  AssertionResult local_ac0 [2];
  Hasher local_aa0;
  Hasher local_a90;
  int local_a80;
  undefined4 local_a7c;
  AssertionResult local_a78 [2];
  Hasher local_a58;
  Hasher local_a48;
  int local_a38;
  undefined4 local_a34;
  AssertionResult local_a30 [2];
  Hasher local_a10;
  Hasher local_a00;
  int local_9f0;
  undefined4 local_9ec;
  AssertionResult local_9e8 [2];
  Hasher local_9c8;
  Hasher local_9b8;
  int local_9a8;
  undefined4 local_9a4;
  AssertionResult local_9a0 [2];
  undefined4 local_97c;
  size_type local_978;
  AssertionResult local_970 [2];
  undefined4 local_94c;
  size_type local_948;
  AssertionResult local_940 [2];
  undefined4 local_91c;
  size_type local_918;
  AssertionResult local_910 [2];
  undefined4 local_8ec;
  size_type local_8e8;
  AssertionResult local_8e0 [2];
  undefined4 local_8bc;
  size_type local_8b8;
  AssertionResult local_8b0 [2];
  undefined4 local_88c;
  size_type local_888;
  AssertionResult local_880 [2];
  AssertionResult local_860 [6];
  value_type local_7f8;
  int local_7f4;
  AssertionResult local_7e0 [11];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_730 [11];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_680 [12];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_5c0 [12];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_4f8 [12];
  undefined1 *local_430;
  value_type *local_428;
  undefined4 local_41c;
  value_type local_418;
  value_type local_414;
  value_type local_410;
  value_type local_40c;
  undefined1 auStack_408 [4];
  int local_404;
  undefined4 local_3ec;
  AssertionResult local_3e8 [11];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_338 [11];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_288 [12];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1c8 [12];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_100 [13];
  int local_18;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffee48 >> 0x20);
  TransparentHasher::TransparentHasher((TransparentHasher *)in_stack_ffffffffffffee50,iVar3);
  local_18 = 0;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)&stack0xffffffffffffffd8,2,
             &stack0xffffffffffffffe8);
  TransparentHasher::TransparentHasher((TransparentHasher *)in_stack_ffffffffffffee50,iVar3);
  TransparentHasher::TransparentHasher((TransparentHasher *)in_stack_ffffffffffffee50,iVar3);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_100,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,
             in_stack_ffffffffffffee68,(allocator_type *)in_stack_ffffffffffffee60);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_100);
  TransparentHasher::TransparentHasher((TransparentHasher *)in_stack_ffffffffffffee50,iVar3);
  TransparentHasher::TransparentHasher((TransparentHasher *)in_stack_ffffffffffffee50,iVar3);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_1c8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,
             in_stack_ffffffffffffee68,(allocator_type *)in_stack_ffffffffffffee60);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_1c8);
  TransparentHasher::TransparentHasher((TransparentHasher *)in_stack_ffffffffffffee50,iVar3);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_288,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,
             in_stack_ffffffffffffee68,(allocator_type *)in_stack_ffffffffffffee60);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_288);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_338,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,
             in_stack_ffffffffffffee68,(allocator_type *)in_stack_ffffffffffffee60);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_338);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_ffffffffffffee80,in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,
             in_stack_ffffffffffffee68,(allocator_type *)in_stack_ffffffffffffee60);
  local_3ec = 1;
  testing::internal::CmpHelperLE<int,int>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb36109);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,(Type)(in_stack_ffffffffffffee78 >> 0x20),
               (char *)in_stack_ffffffffffffee70,(int)((ulong)in_stack_ffffffffffffee68 >> 0x20),
               (char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb3616c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb361dd);
  local_404 = local_18;
  local_418 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffee50,iVar3);
  local_414 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffee50,iVar3);
  local_410 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffee50,iVar3);
  local_40c = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_ffffffffffffee50,iVar3);
  local_41c = 4;
  local_428 = &local_418;
  local_430 = auStack_408;
  TransparentHasher::TransparentHasher((TransparentHasher *)in_stack_ffffffffffffee50,iVar3);
  TransparentHasher::TransparentHasher((TransparentHasher *)in_stack_ffffffffffffee50,iVar3);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_4f8,0,(int *)0x0);
  iVar3 = (int)((ulong)local_4f8 >> 0x20);
  google::
  HashtableInterface_SparseHashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashtable<int_const*>
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,(int *)in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffeea4,in_stack_ffffffffffffeea0));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_4f8);
  TransparentHasher::TransparentHasher((TransparentHasher *)in_stack_ffffffffffffee50,iVar3);
  TransparentHasher::TransparentHasher((TransparentHasher *)in_stack_ffffffffffffee50,iVar3);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_5c0,0,(int *)0x0);
  iVar3 = (int)((ulong)local_5c0 >> 0x20);
  google::
  HashtableInterface_SparseHashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashtable<int_const*>
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,(int *)in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffeea4,in_stack_ffffffffffffeea0));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_5c0);
  TransparentHasher::TransparentHasher((TransparentHasher *)in_stack_ffffffffffffee50,iVar3);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_680,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashtable<int_const*>
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,(int *)in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffeea4,in_stack_ffffffffffffeea0));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_680);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_730,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashtable<int_const*>
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,(int *)in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffeea4,in_stack_ffffffffffffeea0));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_730);
  this_00 = (BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)&stack0xffffffffffffffd8;
  google::
  HashtableInterface_SparseHashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::HashtableInterface_SparseHashtable<int_const*>
            (in_stack_ffffffffffffee90,in_stack_ffffffffffffee88,(int *)in_stack_ffffffffffffee80,
             in_stack_ffffffffffffee78,in_stack_ffffffffffffee70,in_stack_ffffffffffffee68,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffeea4,in_stack_ffffffffffffeea0));
  testing::internal::CmpHelperGT<int,int>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_7e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb36716);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,(Type)(in_stack_ffffffffffffee78 >> 0x20),
               (char *)in_stack_ffffffffffffee70,(int)((ulong)in_stack_ffffffffffffee68 >> 0x20),
               (char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb36779);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb367ea);
  local_404 = local_18;
  for (local_7f4 = 2; type = (Type)(in_stack_ffffffffffffee78 >> 0x20), local_7f4 < 2000;
      local_7f4 = local_7f4 + 1) {
    local_7f8 = HashtableTest<google::HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_ffffffffffffee50,(int)((ulong)this_00 >> 0x20));
    google::
    BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              *)CONCAT44(in_stack_ffffffffffffef94,in_stack_ffffffffffffef90),
             in_stack_ffffffffffffef88);
  }
  testing::internal::CmpHelperGT<int,int>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_860);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb368e2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb36945);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb369b6);
  local_888 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb369c3);
  local_88c = 100;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             in_stack_ffffffffffffee58,(uint *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_880);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb36a5b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb36abe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb36b2f);
  local_8b8 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb36b3c);
  local_8bc = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             in_stack_ffffffffffffee58,(uint *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8b0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb36bd4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb36c37);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb36ca8);
  local_8e8 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb36cb5);
  local_8ec = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             in_stack_ffffffffffffee58,(uint *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_8e0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb36d4d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb36db0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb36e21);
  local_918 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb36e2e);
  local_91c = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             in_stack_ffffffffffffee58,(uint *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_910);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb36ec6);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb36f29);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb36f9a);
  local_948 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb36fa7);
  local_94c = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             in_stack_ffffffffffffee58,(uint *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_940);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb3703f);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb370a2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb37113);
  local_978 = google::
              BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::bucket_count((BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                              *)0xb37120);
  local_97c = 100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             in_stack_ffffffffffffee58,(uint *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_970);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb371b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb3721b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3728c);
  local_9a4 = 0;
  local_9c8 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_ffffffffffffee60);
  local_9b8 = local_9c8;
  local_9a8 = Hasher::id(&local_9b8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_9a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb37378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb373db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3744c);
  local_9ec = 0;
  local_a10 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq(in_stack_ffffffffffffee60);
  local_a00 = local_a10;
  local_9f0 = Hasher::id(&local_a00);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_9e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb37538);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb3759b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3760c);
  local_a34 = 0;
  local_a58 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_ffffffffffffee60);
  local_a48 = local_a58;
  local_a38 = Hasher::id(&local_a48);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a30);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb376f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb3775b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb377cc);
  local_a7c = 0;
  local_aa0 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq(in_stack_ffffffffffffee60);
  local_a90 = local_aa0;
  local_a80 = Hasher::id(&local_a90);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a78);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb378b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb3791b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3798c);
  local_ac4 = 1;
  local_ae8 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_ffffffffffffee60);
  local_ad8 = local_ae8;
  local_ac8 = Hasher::id(&local_ad8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_ac0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb37a78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb37adb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb37b4c);
  local_b0c = 0;
  local_b30 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq(in_stack_ffffffffffffee60);
  local_b20 = local_b30;
  local_b10 = Hasher::id(&local_b20);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b08);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb37c38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb37c9b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb37d0c);
  local_b54 = 1;
  local_b78 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_ffffffffffffee60);
  local_b68 = local_b78;
  local_b58 = Hasher::id(&local_b68);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb37df8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb37e5b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb37ecc);
  local_b9c = 1;
  local_bc0 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq(in_stack_ffffffffffffee60);
  local_bb0 = local_bc0;
  local_ba0 = Hasher::id(&local_bb0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_b98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb37fb8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb3801b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3808c);
  local_be4 = 0;
  local_c08 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_ffffffffffffee60);
  local_bf8 = local_c08;
  local_be8 = Hasher::id(&local_bf8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_be0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb38178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb381db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3824c);
  local_c2c = 0;
  local_c50 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq(in_stack_ffffffffffffee60);
  local_c40 = local_c50;
  local_c30 = Hasher::id(&local_c40);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c28);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb38338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb3839b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3840c);
  local_c74 = 0;
  local_c98 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_ffffffffffffee60);
  local_c88 = local_c98;
  local_c78 = Hasher::id(&local_c88);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_c70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb384f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb3855b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb385cc);
  local_cbc = 0;
  local_ce0 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq(in_stack_ffffffffffffee60);
  local_cd0 = local_ce0;
  local_cc0 = Hasher::id(&local_cd0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_cb8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb386b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb3871b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3878c);
  local_d04 = 1;
  local_d28 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_ffffffffffffee60);
  local_d18 = local_d28;
  local_d08 = Hasher::id(&local_d18);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d00);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb38878);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffeed4,in_stack_ffffffffffffeed0),
               in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb388db);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb3894c);
  local_d4c = 0;
  local_d70 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq(in_stack_ffffffffffffee60);
  iVar3 = local_d70.num_compares_;
  local_d60 = local_d70;
  local_d50 = Hasher::id(&local_d60);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d48);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    in_stack_ffffffffffffeec8 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0xb38a38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar3,in_stack_ffffffffffffeed0),in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb38a9b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb38b0c);
  local_d94 = 1;
  local_db8 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::hash_funct(in_stack_ffffffffffffee60);
  local_da8 = local_db8;
  local_d98 = Hasher::id(&local_da8);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d90);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb38bec);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar3,in_stack_ffffffffffffeed0),in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb38c49);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb38cba);
  local_ddc = 1;
  local_e00 = (Hasher)google::
                      BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::key_eq(in_stack_ffffffffffffee60);
  local_df0 = local_e00;
  local_de0 = Hasher::id(&local_df0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_dd8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb38d9a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar3,in_stack_ffffffffffffeed0),in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb38df7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb38e68);
  local_e24 = 0;
  pAVar4 = &local_e38;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_00);
  local_e28 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(pAVar4);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_e38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffee80);
    testing::AssertionResult::failure_message((AssertionResult *)0xb38f44);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffee80,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar3,in_stack_ffffffffffffeed0),in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb38fa1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb39012);
  local_e5c = 0;
  pAVar4 = &local_e70;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_00);
  local_e60 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(pAVar4);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_e70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e58);
  if (!bVar1) {
    testing::Message::Message((Message *)pAVar4);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xb390ee);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)pAVar4,type,(char *)in_stack_ffffffffffffee70,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar3,in_stack_ffffffffffffeed0),in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb3914b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb391bc);
  local_e94 = 2;
  this_02 = &local_ea8;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_00);
  local_e98 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(this_02);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)in_stack_ffffffffffffee60,
             (int *)in_stack_ffffffffffffee58,(int *)in_stack_ffffffffffffee50);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_ea8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e90);
  if (!bVar1) {
    testing::Message::Message((Message *)pAVar4);
    in_stack_ffffffffffffee68 =
         (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xb39298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)pAVar4,type,(char *)this_02,
               (int)((ulong)in_stack_ffffffffffffee68 >> 0x20),(char *)in_stack_ffffffffffffee60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar3,in_stack_ffffffffffffeed0),in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb392f5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb39366);
  local_ecc = 2;
  this_01 = &local_ee0;
  google::
  BaseHashtableInterface<google::sparse_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::get_allocator(this_00);
  local_ed0 = Alloc<int,_unsigned_long,_18446744073709551615UL>::id(this_01);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)in_stack_ffffffffffffee68,(char *)this_01,(int *)in_stack_ffffffffffffee58,
             (int *)in_stack_ffffffffffffee50);
  line = (int)((ulong)in_stack_ffffffffffffee68 >> 0x20);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_ee0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_ec8);
  if (!bVar1) {
    testing::Message::Message((Message *)pAVar4);
    testing::AssertionResult::failure_message((AssertionResult *)0xb39442);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)pAVar4,type,(char *)this_02,line,(char *)this_01);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(iVar3,in_stack_ffffffffffffeed0),in_stack_ffffffffffffeec8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffee50);
    testing::Message::~Message((Message *)0xb3949f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb39510);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb3951d);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb3952a);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb39537);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb39544);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb39551);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb3955e);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb3956b);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb39578);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb39585);
  google::
  HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb39592);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc
            ((Alloc<int,_unsigned_long,_18446744073709551615UL> *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, Constructors) {
  // The key/value types don't matter here, so I just test on one set
  // of tables, the ones with int keys, which can easily handle the
  // placement-news we have to do below.
  typename TypeParam::hasher hasher(1);  // 1 is a unique id
  int alloc_count = 0;
  Alloc<typename TypeParam::key_type> alloc(2, &alloc_count);

  TypeParam ht_noarg;
  TypeParam ht_onearg(100);
  TypeParam ht_twoarg(100, hasher);
  TypeParam ht_threearg(100, hasher, hasher);  // hasher serves as key_equal too
  TypeParam ht_fourarg(100, hasher, hasher, alloc);

  // The allocator should have been called at most once, for the last ht.
  EXPECT_LE(1, alloc_count);
  int old_alloc_count = alloc_count;

  const typename TypeParam::value_type input[] = {
      this->UniqueObject(1), this->UniqueObject(2), this->UniqueObject(4),
      this->UniqueObject(8)};
  const int num_inputs = sizeof(input) / sizeof(input[0]);
  const typename TypeParam::value_type* begin = &input[0];
  const typename TypeParam::value_type* end = begin + num_inputs;
  TypeParam ht_iter_noarg(begin, end);
  TypeParam ht_iter_onearg(begin, end, 100);
  TypeParam ht_iter_twoarg(begin, end, 100, hasher);
  TypeParam ht_iter_threearg(begin, end, 100, hasher, hasher);
  TypeParam ht_iter_fourarg(begin, end, 100, hasher, hasher, alloc);
  // Now the allocator should have been called more.
  EXPECT_GT(alloc_count, old_alloc_count);
  old_alloc_count = alloc_count;

  // Let's do a lot more inserting and make sure the alloc-count goes up
  for (int i = 2; i < 2000; i++) ht_fourarg.insert(this->UniqueObject(i));
  EXPECT_GT(alloc_count, old_alloc_count);

  EXPECT_LT(ht_noarg.bucket_count(), 100u);
  EXPECT_GE(ht_onearg.bucket_count(), 100u);
  EXPECT_GE(ht_twoarg.bucket_count(), 100u);
  EXPECT_GE(ht_threearg.bucket_count(), 100u);
  EXPECT_GE(ht_fourarg.bucket_count(), 100u);
  EXPECT_GE(ht_iter_onearg.bucket_count(), 100u);

  // When we pass in a hasher -- it can serve both as the hash-function
  // and the key-equal function -- its id should be 1.  Where we don't
  // pass it in and use the default Hasher object, the id should be 0.
  EXPECT_EQ(0, ht_noarg.hash_funct().id());
  EXPECT_EQ(0, ht_noarg.key_eq().id());
  EXPECT_EQ(0, ht_onearg.hash_funct().id());
  EXPECT_EQ(0, ht_onearg.key_eq().id());
  EXPECT_EQ(1, ht_twoarg.hash_funct().id());
  EXPECT_EQ(0, ht_twoarg.key_eq().id());
  EXPECT_EQ(1, ht_threearg.hash_funct().id());
  EXPECT_EQ(1, ht_threearg.key_eq().id());

  EXPECT_EQ(0, ht_iter_noarg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_noarg.key_eq().id());
  EXPECT_EQ(0, ht_iter_onearg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_onearg.key_eq().id());
  EXPECT_EQ(1, ht_iter_twoarg.hash_funct().id());
  EXPECT_EQ(0, ht_iter_twoarg.key_eq().id());
  EXPECT_EQ(1, ht_iter_threearg.hash_funct().id());
  EXPECT_EQ(1, ht_iter_threearg.key_eq().id());

  // Likewise for the allocator
  EXPECT_EQ(0, ht_threearg.get_allocator().id());
  EXPECT_EQ(0, ht_iter_threearg.get_allocator().id());
  EXPECT_EQ(2, ht_fourarg.get_allocator().id());
  EXPECT_EQ(2, ht_iter_fourarg.get_allocator().id());
}